

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O0

uint32_t yatrie_char_add(uint32_t parent_id,uint8_t char_index,trie_s *trie)

{
  byte bVar1;
  byte insert_pos;
  node_s *parent_node_00;
  node_s *parent_node;
  uint8_t pos;
  uint8_t bits;
  uint32_t next_node_id;
  trie_s *trie_local;
  uint8_t char_index_local;
  uint32_t parent_id_local;
  
  parent_node_00 = (node_s *)(trie->nodes + (ulong)parent_id * 2 + 1);
  insert_pos = bit_int32_count((uint32_t *)parent_node_00,'\x01',char_index + 0xff);
  bit_array_rest = char_index & 0x1f;
  bVar1 = bit_array_rest;
  if (bit_array_rest == 0) {
    bVar1 = 0;
  }
  if ((parent_node_00->mask[(int)(char_index - 1) >> 5] >> (bVar1 - 1 & 0x1f) & 1) == 0) {
    parent_node._4_4_ = node_insert_ref(char_index,insert_pos,parent_node_00,trie);
  }
  else {
    parent_node._4_4_ = (&trie->refs[1].increment)[parent_node_00->ref_id + (uint)insert_pos];
  }
  return parent_node._4_4_;
}

Assistant:

uint32_t yatrie_char_add(uint32_t parent_id, uint8_t char_index, trie_s *trie) {
    uint32_t next_node_id;
    uint8_t bits;
    uint8_t pos;
    node_s *parent_node = NODE_GET(parent_id, trie);

    //number of chars (bits) before the current char (bit) position in the alphabet
    //count the number of bits to determine the position of the char
    pos = bit_int32_count(parent_node->mask, 1, char_index - 1);

    //if char exists in the bitmask we need to get next node_s id from the references block
    if (BIT_ARRAY_GET(parent_node->mask, char_index)) {
        next_node_id = REF_GET(parent_node->ref_id, pos, trie);
    } else {
        //else we create new references block bigger than before to insert new reference
        next_node_id = node_insert_ref(char_index, pos, parent_node, trie);
    }

    return next_node_id;
}